

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanContext.h
# Opt level: O2

void __thiscall
jaegertracing::SpanContext::
forEachBaggageItem<std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>>
          (SpanContext *this,
          function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *f)

{
  bool bVar1;
  __node_base *p_Var2;
  
  std::mutex::lock(&this->_mutex);
  p_Var2 = &(this->_baggage)._M_h._M_before_begin;
  do {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) break;
    bVar1 = std::
            function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(f,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var2 + 1),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var2 + 5));
  } while (bVar1);
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return;
}

Assistant:

void forEachBaggageItem(Function f) const
    {
        std::lock_guard<std::mutex> lock(_mutex);
        for (auto&& pair : _baggage) {
            if (!f(pair.first, pair.second)) {
                break;
            }
        }
    }